

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O2

bool __thiscall HPreData::isZeroA(HPreData *this,int i,int j)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  
  piVar3 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar3[i];
  iVar2 = piVar3[(long)i + 1];
  iVar6 = (iVar2 - iVar1) + 1;
  lVar5 = (long)iVar1;
  do {
    iVar6 = iVar6 + -1;
    if ((this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] == j) break;
    bVar4 = lVar5 < iVar2;
    lVar5 = lVar5 + 1;
  } while (bVar4);
  return iVar6 == 0;
}

Assistant:

bool HPreData::isZeroA(int i, int j) {
	int k=ARstart[i];
    while (j != ARindex[k] && k<ARstart[i+1])
            k++;
    if (k==ARstart[i+1]) {
    	return true;
    	}
    return false;
}